

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O2

Section * mocker::genDataSection(Section *__return_storage_ptr__,Module *irModule)

{
  Module *pMVar1;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,".data",&local_69);
  nasm::Section::Section(__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pMVar1 = irModule;
  while (pMVar1 = (Module *)
                  (pMVar1->globalVars).
                  super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
                  _M_impl._M_node.super__List_node_base._M_next, pMVar1 != irModule) {
    std::operator+(&local_68,"L",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(pMVar1->globalVars).
                    super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
                    _M_impl._M_node._M_size);
    nasm::Section::emplaceLine<mocker::nasm::Db,std::__cxx11::string_const&>
              (__return_storage_ptr__,&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(pMVar1->funcs)._M_h._M_element_count);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

nasm::Section genDataSection(const ir::Module &irModule) {
  nasm::Section res(".data");
  for (auto &var : irModule.getGlobalVars()) {
    res.emplaceLine<nasm::Db>("L" + var.getLabel(), var.getData());
  }
  return res;
}